

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingReader.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Type TVar1;
  undefined4 uVar2;
  BarcodeFormat BVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  PointT<int> data;
  undefined8 *puVar9;
  ostream *poVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  Result *this;
  PointT<int> PVar15;
  uint uVar16;
  int iVar17;
  Result *pRVar18;
  long lVar19;
  long in_FS_OFFSET;
  Barcodes merged;
  int channels;
  Barcodes barcodes;
  int height;
  int width;
  CLI cli;
  Barcodes allBarcodes;
  ImageView image;
  undefined1 local_210 [32];
  undefined8 local_1f0;
  undefined4 local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [24];
  PointT<int> local_1a0;
  undefined1 local_198 [16];
  PointT<int> local_188;
  long local_180;
  uint local_174;
  int local_170;
  int local_16c;
  undefined1 local_168 [24];
  bool *local_150;
  long local_148;
  bool local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  Error *local_120;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> local_118;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  PointT<int> local_80;
  Result *local_78;
  ostream *local_70;
  ImageView local_68;
  
  local_1e8._0_2_ = 0;
  local_1e8._2_1_ = None;
  local_1e8._3_1_ = 0;
  local_1f0 = (pointer)0x1f4ff0200082d2f;
  local_150 = local_140;
  local_168._16_8_ = 0;
  local_168._0_4_ = 0;
  local_168._4_4_ = 0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_148 = 0;
  local_140[0] = false;
  local_130._M_allocated_capacity._0_4_ = 0;
  local_130._M_allocated_capacity._4_4_ = 0;
  local_130._M_local_buf[8] = '\0';
  local_130._M_local_buf[9] = '\0';
  local_130._M_local_buf[10] = '\0';
  local_118.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < argc) {
    uVar16 = 1;
LAB_001098e9:
    pcVar12 = argv[(int)uVar16];
    sVar8 = strlen(pcVar12);
    iVar6 = strncmp(pcVar12,"-fast",sVar8);
    if (iVar6 == 0) {
      local_1f0 = (pointer)((ulong)local_1f0 & 0xfffffffffffffffe);
    }
    else {
      iVar6 = strncmp(pcVar12,"-norotate",sVar8);
      if (iVar6 == 0) {
        local_1f0 = (pointer)((ulong)local_1f0 & 0xfffffffffffffffd);
      }
      else {
        iVar6 = strncmp(pcVar12,"-noinvert",sVar8);
        if (iVar6 == 0) {
          local_1f0 = (pointer)((ulong)local_1f0 & 0xfffffffffffffffb);
        }
        else {
          iVar6 = strncmp(pcVar12,"-noscale",sVar8);
          if (iVar6 == 0) {
            local_1f0 = (pointer)((ulong)local_1f0 & 0xfffffffffffffff7);
          }
          else {
            iVar6 = strncmp(pcVar12,"-single",sVar8);
            if (iVar6 == 0) {
              local_1f0._0_6_ = CONCAT15(1,(undefined5)local_1f0);
            }
            else {
              iVar6 = strncmp(pcVar12,"-ispure",sVar8);
              if (iVar6 == 0) {
                uVar7 = (uint)local_1f0 & 0xfffcffef | 0x20010;
                goto LAB_00109afe;
              }
              iVar6 = strncmp(pcVar12,"-errors",sVar8);
              if (iVar6 == 0) {
                local_1f0 = (pointer)((ulong)local_1f0 | 0x200);
              }
              else {
                iVar6 = strncmp(pcVar12,"-format",sVar8);
                if (iVar6 == 0) {
                  uVar16 = uVar16 + 1;
                  if (uVar16 == argc) goto LAB_0010afd7;
                  pcVar12 = argv[(int)uVar16];
                  sVar8 = strlen(pcVar12);
                  local_1e8 = ZXing::BarcodeFormatsFromString(sVar8,pcVar12);
                }
                else {
                  iVar6 = strncmp(pcVar12,"-binarizer",sVar8);
                  if (iVar6 == 0) {
                    uVar16 = uVar16 + 1;
                    if (uVar16 == argc) goto LAB_0010afd7;
                    pcVar12 = argv[(int)uVar16];
                    sVar8 = strlen(pcVar12);
                    iVar6 = strncmp(pcVar12,"local",sVar8);
                    if (iVar6 == 0) {
                      local_1f0 = (pointer)((ulong)local_1f0 & 0xfffffffffffcffff);
                      goto LAB_00109db7;
                    }
                    iVar6 = strncmp(pcVar12,"global",sVar8);
                    if (iVar6 == 0) {
                      uVar7 = (uint)local_1f0 & 0xfffcffff | 0x10000;
                    }
                    else {
                      iVar6 = strncmp(pcVar12,"fixed",sVar8);
                      if (iVar6 != 0) goto LAB_0010afd7;
                      uVar7 = (uint)local_1f0 & 0xfffcffff | 0x20000;
                    }
                  }
                  else {
                    iVar6 = strncmp(pcVar12,"-mode",sVar8);
                    if (iVar6 != 0) {
                      iVar6 = strncmp(pcVar12,"-1",sVar8);
                      if (iVar6 == 0) {
                        local_130._M_local_buf[8] = '\x01';
                      }
                      else {
                        iVar6 = strncmp(pcVar12,"-bytes",sVar8);
                        if (iVar6 == 0) {
                          local_130._M_local_buf[9] = '\x01';
                        }
                        else {
                          iVar6 = strncmp(pcVar12,"-symbol",sVar8);
                          if (iVar6 == 0) {
                            local_130._M_local_buf[10] = '\x01';
                          }
                          else {
                            iVar6 = strncmp(pcVar12,"-pngout",sVar8);
                            if (iVar6 == 0) {
                              uVar16 = uVar16 + 1;
                              if (uVar16 == argc) goto LAB_0010afd7;
                              std::__cxx11::string::operator=
                                        ((string *)&local_150,argv[(int)uVar16]);
                            }
                            else {
                              iVar6 = strncmp(pcVar12,"-channels",sVar8);
                              if (iVar6 == 0) {
                                uVar16 = uVar16 + 1;
                                if (uVar16 == argc) goto LAB_0010afd7;
                                local_130._M_allocated_capacity._0_4_ = atoi(argv[(int)uVar16]);
                              }
                              else {
                                bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                  ((anon_class_16_2_fc49f3d4 *)argv,
                                                   (char *)(ulong)uVar16);
                                if (bVar4) {
                                  uVar16 = uVar16 + 1;
                                  if (uVar16 == argc) goto LAB_0010afd7;
                                  local_130._M_allocated_capacity._4_4_ = atoi(argv[(int)uVar16]);
                                }
                                else {
                                  bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                    ((anon_class_16_2_fc49f3d4 *)argv,
                                                     (char *)(ulong)uVar16);
                                  if ((bVar4) ||
                                     (bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                        ((anon_class_16_2_fc49f3d4 *)argv,
                                                         (char *)(ulong)uVar16), bVar4))
                                  goto LAB_0010af0c;
                                  bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                    ((anon_class_16_2_fc49f3d4 *)argv,
                                                     (char *)(ulong)uVar16);
                                  if ((bVar4) ||
                                     (bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                        ((anon_class_16_2_fc49f3d4 *)argv,
                                                         (char *)(ulong)uVar16), bVar4)) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"ZXingReader ",0xc);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"2.2.1",5);
                                    std::operator<<((ostream *)&std::cout,"\n");
                                    goto LAB_0010af59;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_210,pcVar12,
                                             (allocator<char> *)&local_68);
                                  std::
                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  ::emplace_back<std::__cxx11::string>
                                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                              *)local_168,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_210);
                                  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                                    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00109db7;
                    }
                    uVar16 = uVar16 + 1;
                    if (uVar16 == argc) goto LAB_0010afd7;
                    pcVar12 = argv[(int)uVar16];
                    sVar8 = strlen(pcVar12);
                    iVar6 = strncmp(pcVar12,"plain",sVar8);
                    if (iVar6 == 0) {
                      local_1f0 = (pointer)((ulong)local_1f0 & 0xffffffffffe3ffff);
                      goto LAB_00109db7;
                    }
                    iVar6 = strncmp(pcVar12,"eci",sVar8);
                    if (iVar6 == 0) {
                      uVar7 = (uint)local_1f0 & 0xffe3ffff | 0x40000;
                    }
                    else {
                      iVar6 = strncmp(pcVar12,"hri",sVar8);
                      if (iVar6 == 0) {
                        uVar7 = (uint)local_1f0 & 0xffe3ffff | 0x80000;
                        goto LAB_00109afe;
                      }
                      bVar4 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                        ((anon_class_16_2_fc49f3d4 *)argv,(char *)(ulong)uVar16);
                      if (!bVar4) goto LAB_0010afd7;
                      uVar7 = (uint)local_1f0 & 0xffe3ffff | 0x100000;
                    }
                  }
LAB_00109afe:
                  local_1f0 = (pointer)CONCAT44(local_1f0._4_4_,uVar7);
                }
              }
            }
          }
        }
      }
    }
LAB_00109db7:
    uVar16 = uVar16 + 1;
    if (argc <= (int)uVar16) goto code_r0x00109dc1;
    goto LAB_001098e9;
  }
  goto LAB_0010afd7;
code_r0x00109dc1:
  local_80.x = local_168._8_4_;
  local_80.y = local_168._12_4_;
  if (local_168._0_8_ != local_168._8_8_) {
    *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
         *(uint *)(malloc + *(long *)(std::cout + -0x18)) | 1;
    local_1e4 = 0;
    PVar15 = (PointT<int>)local_168._0_8_;
    do {
      data = (PointT<int>)
             stbi_load(*(char **)PVar15,&local_16c,&local_170,(int *)(local_1e0 + 0x24),
                       local_130._M_allocated_capacity._0_4_);
      if (data == (PointT<int>)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to read image: ",0x16);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,*(char **)PVar15,*(long *)((long)PVar15 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
        pcVar12 = *(char **)(in_FS_OFFSET + -0x20);
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        local_1e4 = 0xffffffff;
        break;
      }
      uVar2 = local_130._M_allocated_capacity._0_4_;
      if (local_130._M_allocated_capacity._0_4_ == 0) {
        uVar2 = local_1e0._36_4_;
      }
      local_1e0._36_4_ = uVar2;
      local_1a0 = data;
      if (4 < (uint)uVar2) {
        std::__throw_out_of_range_fmt
                  ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar2,5);
LAB_0010af0c:
        PrintUsage((char *)((ImageView *)argv)->_data);
LAB_0010af59:
        exit(0);
      }
      ZXing::ImageView::ImageView
                (&local_68,(uint8_t *)data,local_16c,local_170,
                 *(ImageFormat *)(&DAT_0011d484 + (long)(int)uVar2 * 4),0,0);
      argv = (char **)local_210;
      ZXing::ImageView::rotated((ImageView *)argv,&local_68,local_130._M_allocated_capacity._4_4_);
      ZXing::ReadBarcodes((ImageView *)local_1b8,(ReaderOptions *)argv);
      if (local_1b8._0_8_ == local_1b8._8_8_) {
        std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::emplace_back<>
                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_1b8);
      }
      std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>
                ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)&local_118,
                 local_118.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl
                 .super__Vector_impl_data._M_finish,local_1b8._0_8_,local_1b8._8_8_);
      sVar8 = *(size_t *)((long)PVar15 + 8);
      if ((sVar8 == *(size_t *)(local_168._8_8_ - 0x18)) &&
         ((sVar8 == 0 ||
          (iVar6 = bcmp(*(void **)PVar15,*(void **)(local_168._8_8_ - 0x20),sVar8), iVar6 == 0)))) {
        ZXing::MergeStructuredAppendSequences((vector *)local_210);
        std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
        _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>>
                  ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)local_1b8,local_1b8._8_8_,
                   local_210._0_8_,local_210._8_8_);
        std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_210);
      }
      local_78 = (Result *)local_1b8._8_8_;
      this = (Result *)local_1b8._0_8_;
      pRVar18 = (Result *)local_1b8._8_8_;
      local_198._0_8_ = PVar15;
      if (local_1b8._0_8_ != local_1b8._8_8_) {
        do {
          if (local_148 != 0) {
            TVar1 = (this->_error)._type;
            lVar19 = 0xd;
            do {
              drawLine(&local_68,
                       (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems
                       [lVar19 + -0xd],
                       (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems
                       [(int)lVar19 - 0xcU & 3],TVar1 != None);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x11);
          }
          local_174 = (uint)(this->_error)._type;
          if (local_130._M_local_buf[9] == '\x01') {
            puVar9 = (undefined8 *)ZXing::Result::bytes();
            argv = (char **)*puVar9;
            ZXing::Result::bytes();
            std::ostream::write((char *)&std::cout,(long)argv);
          }
          else {
            local_120 = &this->_error;
            if (local_130._M_local_buf[8] == '\x01') {
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,*(char **)local_198._0_8_,
                                   *(long *)(local_198._0_8_ + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ZXing::ToString_abi_cxx11_((BarcodeFormat)local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_210._0_8_,local_210._8_8_);
              if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
              }
              cVar5 = ZXing::Result::isValid();
              if (cVar5 == '\0') {
                if ((this->_error)._type != None) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  ZXing::ToString_abi_cxx11_((Error *)local_210);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_210._0_8_,local_210._8_8_);
                  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                  }
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \"",2);
                ZXing::Result::text_abi_cxx11_((TextMode)local_210);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_210._0_8_,local_210._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
              }
              argv = (char **)0x1;
              pcVar12 = "\n";
            }
            else {
              uVar14 = local_168._8_8_ - local_168._0_8_;
              if ((0x20 < uVar14) ||
                 (1 < (ulong)(((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 3) * -0x7b425ed097b425ed
                             ))) {
                if (main::firstFile == '\x01') {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                  uVar14 = local_168._8_8_ - local_168._0_8_;
                }
                if (0x20 < uVar14) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"File:       ",0xc);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,*(char **)local_198._0_8_,
                                       *(long *)(local_198._0_8_ + 8));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                }
                main::firstFile = '\x01';
              }
              if (this->_format != None) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Text:       \"",0xd);
                ZXing::Result::text_abi_cxx11_();
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_1e0._0_8_,local_1e0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Bytes:      ",0xc);
                if (((uint)local_1f0 & 0x1c0000) == 0x40000) {
                  ZXing::Result::bytesECI();
                }
                else {
                  __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ZXing::Result::bytes();
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (local_198 + 8),__x);
                }
                local_210._0_8_ = local_210 + 0x10;
                local_70 = poVar10;
                std::__cxx11::string::_M_construct
                          ((ulong)local_210,((char)local_188.x - (char)local_198._8_8_) * '\x03');
                if (local_188 != (PointT<int>)local_198._8_8_) {
                  lVar19 = 0;
                  uVar14 = 0;
                  do {
                    snprintf((char *)(local_210._0_8_ + lVar19),4,"%02X ",
                             (ulong)*(byte *)(local_198._8_8_ + uVar14));
                    uVar14 = uVar14 + 1;
                    lVar19 = lVar19 + 3;
                  } while (uVar14 < (ulong)((long)local_188 - local_198._8_8_));
                }
                std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_210);
                poVar10 = local_70;
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_a0,local_98);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Format:     ",0xc);
                ZXing::ToString_abi_cxx11_((BarcodeFormat)local_210);
                pRVar18 = local_78;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_210._0_8_,local_210._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Identifier: ",0xc);
                ZXing::Result::symbologyIdentifier_abi_cxx11_();
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_c0,local_b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Content:    ",0xc);
                ZXing::Result::contentType();
                ZXing::ToString_abi_cxx11_((ContentType)&local_e0);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_e0,local_d8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"HasECI:     ",0xc);
                ZXing::Result::hasECI();
                poVar10 = std::ostream::_M_insert<bool>(SUB81(poVar10,0));
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Position:   ",0xc);
                ZXing::ToString<int>(&local_100,&this->_position);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_100._M_dataplus._M_p,local_100._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Rotation:   ",0xc);
                iVar6 = ZXing::Result::orientation();
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," deg\n",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"IsMirrored: ",0xc);
                argv = (char **)std::ostream::_M_insert<bool>(SUB81(poVar10,0));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)argv,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)argv,"IsInverted: ",0xc);
                poVar10 = std::ostream::_M_insert<bool>(SUB81(argv,0));
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                if (local_e0 != local_d0) {
                  operator_delete(local_e0,local_d0[0] + 1);
                }
                if (local_c0 != local_b0) {
                  operator_delete(local_c0,local_b0[0] + 1);
                }
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
                if (local_a0 != local_90) {
                  operator_delete(local_a0,local_90[0] + 1);
                }
                if ((PointT<int>)local_198._8_8_ != (PointT<int>)0x0) {
                  operator_delete((void *)local_198._8_8_,local_180 - local_198._8_8_);
                }
                if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                  operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
                }
                ZXing::Result::ecLevel_abi_cxx11_();
                if ((pointer)local_210._8_8_ != (pointer)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"EC Level:   ",0xc);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_210._0_8_,local_210._8_8_
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                }
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
                ZXing::Result::version_abi_cxx11_();
                if ((pointer)local_210._8_8_ != (pointer)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Version:    ",0xc);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_210._0_8_,local_210._8_8_
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                }
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
                ZXing::ToString_abi_cxx11_((Error *)local_210);
                if ((pointer)local_210._8_8_ != (pointer)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Error:      ",0xc);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_210._0_8_,local_210._8_8_
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                }
                if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                }
                if (this->_lineCount != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Lines:      ",0xc);
                  poVar10 = (ostream *)
                            std::ostream::operator<<((ostream *)&std::cout,this->_lineCount);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                }
                BVar3 = this->_format;
                if ((BVar3 & ~(UPCE|UPCA|EAN13|EAN8)) == None) {
                  if (BVar3 != None) {
                    ZXing::Result::text_abi_cxx11_();
                    ZXing::GTIN::LookupCountryIdentifier
                              ((string *)local_210,(BarcodeFormat)local_1e0);
                    if ((pointer)local_210._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Country:    ",0xc);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_210._0_8_,
                                           local_210._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                    }
                    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                    }
                    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                      operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_210);
                    if ((pointer)local_210._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Add-On:     ",0xc);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_210._0_8_,
                                           local_210._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                    }
                    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_1e0);
                    ZXing::GTIN::Price((string *)local_210);
                    if ((pointer)local_210._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Price:      ",0xc);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_210._0_8_,
                                           local_210._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                    }
                    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                    }
                    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                      operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_1e0);
                    ZXing::GTIN::IssueNr((string *)local_210);
                    if ((pointer)local_210._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Issue #:    ",0xc);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_210._0_8_,
                                           local_210._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                    }
                    goto LAB_0010ab5e;
                  }
                }
                else if ((BVar3 == ITF) &&
                        (piVar11 = (int *)ZXing::Result::bytes(), piVar11[2] - *piVar11 == 0xe)) {
                  ZXing::Result::text_abi_cxx11_();
                  ZXing::GTIN::LookupCountryIdentifier((string *)local_210,(BarcodeFormat)local_1e0)
                  ;
                  if ((pointer)local_210._8_8_ != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Country:    ",0xc);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)local_210._0_8_,
                                         local_210._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  }
LAB_0010ab5e:
                  argv = (char **)local_1e0;
                  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                  }
                  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
                    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
                  }
                }
                bVar4 = ZXing::Result::isPartOfSequence(this);
                if (bVar4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Structured Append: symbol ",0x1a);
                  iVar6 = ZXing::Result::sequenceIndex();
                  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6 + 1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," of ",4);
                  iVar6 = ZXing::Result::sequenceSize();
                  argv = (char **)std::ostream::operator<<(poVar10,iVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)argv," (parity/id: \'",0xe);
                  ZXing::Result::sequenceId_abi_cxx11_();
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)argv,(char *)local_210._0_8_,local_210._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\')\n",3);
LAB_0010acc6:
                  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
                  }
                }
                else {
                  iVar6 = ZXing::Result::sequenceSize();
                  if (0 < iVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Structured Append: merged result from ",0x26);
                    iVar6 = ZXing::Result::sequenceSize();
                    argv = (char **)std::ostream::operator<<((ostream *)&std::cout,iVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)argv," symbols (parity/id: \'",0x16);
                    ZXing::Result::sequenceId_abi_cxx11_();
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)argv,(char *)local_210._0_8_,local_210._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\')\n",3);
                    goto LAB_0010acc6;
                  }
                }
                if (this->_readerInit == true) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Reader Initialisation/Programming\n",0x22);
                }
                goto LAB_0010a2cb;
              }
              argv = (char **)0x11;
              pcVar12 = "No barcode found\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,pcVar12,(long)argv);
          }
LAB_0010a2cb:
          local_1e4 = local_1e4 | local_174;
          this = this + 1;
        } while (this != pRVar18);
      }
      if (((local_168._8_8_ - local_168._0_8_ & 0x1fffffffe0) == 0x20) && (local_148 != 0)) {
        stbi_write_png(local_150,local_68._width,local_68._height,3,local_68._data,
                       local_68._rowStride);
      }
      pcVar12 = getenv("MEASURE_PERF");
      if (pcVar12 != (char *)0x0) {
        iVar6 = 1;
        argv = (char **)0x0;
        lVar19 = std::chrono::_V2::system_clock::now();
        do {
          iVar17 = iVar6;
          if (0 < iVar6) {
            do {
              ZXing::ReadBarcodes((ImageView *)&stack0xffffffffffffffb8,(ReaderOptions *)&local_68);
              std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                        ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                         &stack0xffffffffffffffb8);
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          uVar16 = (int)argv + iVar6;
          argv = (char **)(ulong)uVar16;
          lVar13 = std::chrono::_V2::system_clock::now();
          uVar14 = lVar13 - lVar19;
          iVar17 = iVar6 * 10;
          if (99999999 < (long)uVar14) {
            iVar17 = iVar6;
          }
          if (999 < iVar6) {
            iVar17 = iVar6;
          }
          iVar6 = iVar17;
        } while ((long)uVar14 < 1000000000);
        printf("time: %5.2f ms per frame\n",(double)(uVar14 / 1000000) / (double)(int)uVar16);
      }
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_1b8);
      free((void *)local_1a0);
      PVar15 = (PointT<int>)(local_198._0_8_ + 0x20);
    } while (PVar15 != local_80);
    goto LAB_0010afe7;
  }
LAB_0010afd7:
  local_1e4 = 0xffffffff;
  PrintUsage(*argv);
LAB_0010afe7:
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(&local_118);
  if (local_150 != local_140) {
    operator_delete(local_150,CONCAT71(local_140._1_7_,local_140[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  return local_1e4;
}

Assistant:

int main(int argc, char* argv[])
{
	ReaderOptions options;
	CLI cli;
	Barcodes allBarcodes;
	int ret = 0;

	options.setTextMode(TextMode::HRI);
	options.setEanAddOnSymbol(EanAddOnSymbol::Read);

	if (!ParseOptions(argc, argv, options, cli)) {
		PrintUsage(argv[0]);
		return -1;
	}

	std::cout.setf(std::ios::boolalpha);

	for (const auto& filePath : cli.filePaths) {
		int width, height, channels;
		std::unique_ptr<stbi_uc, void (*)(void*)> buffer(stbi_load(filePath.c_str(), &width, &height, &channels, cli.forceChannels),
														 stbi_image_free);
		if (buffer == nullptr) {
			std::cerr << "Failed to read image: " << filePath << " (" << stbi_failure_reason() << ")" << "\n";
			return -1;
		}
		channels = cli.forceChannels ? cli.forceChannels : channels;

		auto ImageFormatFromChannels = std::array{ImageFormat::None, ImageFormat::Lum, ImageFormat::LumA, ImageFormat::RGB, ImageFormat::RGBA};
		ImageView image{buffer.get(), width, height, ImageFormatFromChannels.at(channels)};
		auto barcodes = ReadBarcodes(image.rotated(cli.rotate), options);

		// if we did not find anything, insert a dummy to produce some output for each file
		if (barcodes.empty())
			barcodes.emplace_back();

		allBarcodes.insert(allBarcodes.end(), barcodes.begin(), barcodes.end());
		if (filePath == cli.filePaths.back()) {
			auto merged = MergeStructuredAppendSequences(allBarcodes);
			// report all merged sequences as part of the last file to make the logic not overly complicated here
			barcodes.insert(barcodes.end(), std::make_move_iterator(merged.begin()), std::make_move_iterator(merged.end()));
		}

		for (auto&& barcode : barcodes) {

			if (!cli.outPath.empty())
				drawRect(image, barcode.position(), bool(barcode.error()));

			ret |= static_cast<int>(barcode.error().type());

			if (cli.bytesOnly) {
				std::cout.write(reinterpret_cast<const char*>(barcode.bytes().data()), barcode.bytes().size());
				continue;
			}

			if (cli.oneLine) {
				std::cout << filePath << " " << ToString(barcode.format());
				if (barcode.isValid())
					std::cout << " \"" << barcode.text(TextMode::Escaped) << "\"";
				else if (barcode.error())
					std::cout << " " << ToString(barcode.error());
				std::cout << "\n";
				continue;
			}

			if (cli.filePaths.size() > 1 || barcodes.size() > 1) {
				static bool firstFile = true;
				if (!firstFile)
					std::cout << "\n";
				if (cli.filePaths.size() > 1)
					std::cout << "File:       " << filePath << "\n";
				firstFile = false;
			}

			if (barcode.format() == BarcodeFormat::None) {
				std::cout << "No barcode found\n";
				continue;
			}

			std::cout << "Text:       \"" << barcode.text() << "\"\n"
					  << "Bytes:      " << ToHex(options.textMode() == TextMode::ECI ? barcode.bytesECI() : barcode.bytes()) << "\n"
					  << "Format:     " << ToString(barcode.format()) << "\n"
					  << "Identifier: " << barcode.symbologyIdentifier() << "\n"
					  << "Content:    " << ToString(barcode.contentType()) << "\n"
					  << "HasECI:     " << barcode.hasECI() << "\n"
					  << "Position:   " << ToString(barcode.position()) << "\n"
					  << "Rotation:   " << barcode.orientation() << " deg\n"
					  << "IsMirrored: " << barcode.isMirrored() << "\n"
					  << "IsInverted: " << barcode.isInverted() << "\n";

			auto printOptional = [](const char* key, const std::string& v) {
				if (!v.empty())
					std::cout << key << v << "\n";
			};

			printOptional("EC Level:   ", barcode.ecLevel());
			printOptional("Version:    ", barcode.version());
			printOptional("Error:      ", ToString(barcode.error()));

			if (barcode.lineCount())
				std::cout << "Lines:      " << barcode.lineCount() << "\n";

			if ((BarcodeFormat::EAN13 | BarcodeFormat::EAN8 | BarcodeFormat::UPCA | BarcodeFormat::UPCE)
					.testFlag(barcode.format())) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
				printOptional("Add-On:     ", GTIN::EanAddOn(barcode));
				printOptional("Price:      ", GTIN::Price(GTIN::EanAddOn(barcode)));
				printOptional("Issue #:    ", GTIN::IssueNr(GTIN::EanAddOn(barcode)));
			} else if (barcode.format() == BarcodeFormat::ITF && Size(barcode.bytes()) == 14) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
			}

			if (barcode.isPartOfSequence())
				std::cout << "Structured Append: symbol " << barcode.sequenceIndex() + 1 << " of "
						  << barcode.sequenceSize() << " (parity/id: '" << barcode.sequenceId() << "')\n";
			else if (barcode.sequenceSize() > 0)
				std::cout << "Structured Append: merged result from " << barcode.sequenceSize() << " symbols (parity/id: '"
						  << barcode.sequenceId() << "')\n";

			if (barcode.readerInit())
				std::cout << "Reader Initialisation/Programming\n";

#ifdef ZXING_EXPERIMENTAL_API
			if (cli.showSymbol && barcode.symbol().data())
				std::cout << "Symbol:\n" << WriteBarcodeToUtf8(barcode);
#endif
		}

		if (Size(cli.filePaths) == 1 && !cli.outPath.empty())
			stbi_write_png(cli.outPath.c_str(), image.width(), image.height(), 3, image.data(), image.rowStride());

#ifdef NDEBUG
		if (getenv("MEASURE_PERF")) {
			auto startTime = std::chrono::high_resolution_clock::now();
			auto duration = startTime - startTime;
			int N = 0;
			int blockSize = 1;
			do {
				for (int i = 0; i < blockSize; ++i)
					ReadBarcodes(image, options);
				N += blockSize;
				duration = std::chrono::high_resolution_clock::now() - startTime;
				if (blockSize < 1000 && duration < std::chrono::milliseconds(100))
					blockSize *= 10;
			} while (duration < std::chrono::seconds(1));
			printf("time: %5.2f ms per frame\n", double(std::chrono::duration_cast<std::chrono::milliseconds>(duration).count()) / N);
		}
#endif
	}

	return ret;
}